

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

FeatureDescription * __thiscall
CoreML::Specification::FeatureDescription::New(FeatureDescription *this,Arena *arena)

{
  FeatureDescription *this_00;
  
  this_00 = (FeatureDescription *)operator_new(0x30);
  FeatureDescription(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FeatureDescription>(arena,this_00);
  }
  return this_00;
}

Assistant:

FeatureDescription* FeatureDescription::New(::google::protobuf::Arena* arena) const {
  FeatureDescription* n = new FeatureDescription;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}